

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_tcp_addr_cpy(int fd,int family,sockaddr *addrinfo)

{
  fio_data_s *pfVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  
  lVar4 = (ulong)(uint)fd * 0xa8;
  pcVar2 = inet_ntop(family,addrinfo->sa_data + (ulong)(family != 2) * 4 + 2,
                     (char *)((long)fio_data + lVar4 + 0x72),0x30);
  pfVar1 = fio_data;
  if (pcVar2 == (char *)0x0) {
    *(undefined2 *)((long)fio_data + lVar4 + 0x71) = 0;
  }
  else {
    sVar3 = strlen((char *)((long)fio_data + lVar4 + 0x72));
    *(char *)((long)pfVar1 + lVar4 + 0x71) = (char)sVar3;
  }
  return;
}

Assistant:

static void fio_tcp_addr_cpy(int fd, int family, struct sockaddr *addrinfo) {
  const char *result =
      inet_ntop(family,
                family == AF_INET
                    ? (void *)&(((struct sockaddr_in *)addrinfo)->sin_addr)
                    : (void *)&(((struct sockaddr_in6 *)addrinfo)->sin6_addr),
                (char *)fd_data(fd).addr, sizeof(fd_data(fd).addr));
  if (result) {
    fd_data(fd).addr_len = strlen((char *)fd_data(fd).addr);
  } else {
    fd_data(fd).addr_len = 0;
    fd_data(fd).addr[0] = 0;
  }
}